

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O1

void __thiscall YacclabTests::CheckAlgorithmsExistence(YacclabTests *this)

{
  pointer pbVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  char *__end;
  pointer s;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  s = (this->mode_cfg_->ccl_algorithms).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->mode_cfg_->ccl_algorithms).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (s != pbVar1) {
    do {
      bVar2 = LabelingMapSingleton::Exists(s);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->mode_cfg_->ccl_existing_algorithms,s);
      }
      else {
        std::operator+(&local_50,"Unable to find the algorithm \'",s);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_90.field_2._M_allocated_capacity = *psVar4;
          local_90.field_2._8_4_ = (undefined4)plVar3[3];
          local_90.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar4;
          local_90._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_90._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
        OutputBox::Cwarning(&this->ob_,&local_90,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      s = s + 1;
    } while (s != pbVar1);
  }
  return;
}

Assistant:

void YacclabTests::CheckAlgorithmsExistence() {
    for (auto& algo_name : mode_cfg_.ccl_algorithms) {
        if (!LabelingMapSingleton::Exists(algo_name)) {
            ob_.Cwarning("Unable to find the algorithm '" + algo_name + "'");
        }
        else {
            mode_cfg_.ccl_existing_algorithms.push_back(algo_name);
        }
    }
}